

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.hpp
# Opt level: O1

void __thiscall
SimpleBVH::BVH::intersect_box
          (BVH *this,VectorMax3d *bbd0,VectorMax3d *bbd1,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *list)

{
  ulong uVar1;
  pointer piVar2;
  pointer puVar3;
  long lVar4;
  long lVar5;
  undefined1 auStack_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  
  uVar1 = (bbd0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.m_rows;
  if ((uVar1 & 0xfffffffffffffffe) != 2) {
    __assert_fail("bbd0.size() == 2 || bbd0.size() == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.hpp"
                  ,0x30,
                  "void SimpleBVH::BVH::intersect_box(const VectorMax3d &, const VectorMax3d &, std::vector<unsigned int> &) const"
                 );
  }
  if (uVar1 == (bbd1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>).m_storage.
               m_rows) {
    auStack_38 = (undefined1  [8])0x0;
    tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (-1 < this->n_corners) {
      box_search_recursive
                (this,bbd0,bbd1,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_38,1,
                 0,(int)this->n_corners);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (list,(long)tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start - (long)auStack_38 >> 2);
      if ((long)tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start - (long)auStack_38 != 0) {
        lVar4 = (long)tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start - (long)auStack_38 >> 2;
        piVar2 = (this->new2old).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar3 = (list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar5 = 0;
        do {
          puVar3[lVar5] = piVar2[*(uint *)((long)auStack_38 + lVar5 * 4)];
          lVar5 = lVar5 + 1;
        } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
      }
      if (auStack_38 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_38,
                        (long)tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_38);
      }
      return;
    }
    __assert_fail("n_corners >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.hpp"
                  ,0x34,
                  "void SimpleBVH::BVH::intersect_box(const VectorMax3d &, const VectorMax3d &, std::vector<unsigned int> &) const"
                 );
  }
  __assert_fail("bbd0.size() == bbd1.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.hpp"
                ,0x31,
                "void SimpleBVH::BVH::intersect_box(const VectorMax3d &, const VectorMax3d &, std::vector<unsigned int> &) const"
               );
}

Assistant:

void intersect_box(
        const VectorMax3d& bbd0,
        const VectorMax3d& bbd1,
        std::vector<unsigned int>& list) const
    {
        assert(bbd0.size() == 2 || bbd0.size() == 3);
        assert(bbd0.size() == bbd1.size());

        std::vector<unsigned int> tmp;
        assert(n_corners >= 0);
        box_search_recursive(bbd0, bbd1, tmp, 1, 0, n_corners);

        list.resize(tmp.size());
        for (int i = 0; i < tmp.size(); ++i)
            list[i] = new2old[tmp[i]];
    }